

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall
Wasm::WasmBytecodeGenerator::SetUnreachableState(WasmBytecodeGenerator *this,bool isUnreachable)

{
  Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer> *this_00;
  Type *pTVar1;
  Type pEVar2;
  code *pcVar3;
  bool bVar4;
  EmitInfo in_RAX;
  undefined4 *puVar5;
  EmitInfo *pEVar6;
  undefined7 in_register_00000031;
  int iVar7;
  EmitInfo local_38;
  EmitInfo info;
  
  this->m_writer =
       (IWasmByteCodeWriter *)(this->mTypedRegisterAllocator).mTypeSpaces[(ulong)!isUnreachable - 4]
  ;
  if ((int)CONCAT71(in_register_00000031,isUnreachable) != 0) {
    iVar7 = (this->m_evalStack).list.
            super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count;
    local_38 = in_RAX;
    if (iVar7 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x85a,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
      iVar7 = (this->m_evalStack).list.
              super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count;
    }
    this_00 = &this->m_evalStack;
    pEVar6 = JsUtil::ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>::Item
                       ((ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer> *)
                        this_00,iVar7 + -1);
    if (pEVar6->type != Limit) {
      iVar7 = 0;
      do {
        local_38 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::
                   Pop(this_00);
        ReleaseLocation(this,&local_38);
        pEVar6 = JsUtil::ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>::Item
                           ((ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer> *
                            )this_00,(this->m_evalStack).list.
                                     super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>
                                     .count + -1);
        iVar7 = iVar7 + -1;
      } while (pEVar6->type != Limit);
      for (; iVar7 != 0; iVar7 = iVar7 + 1) {
        JsUtil::
        List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
        EnsureArray(&this_00->list,0);
        pEVar2 = (this->m_evalStack).list.
                 super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer
                 + (this->m_evalStack).list.
                   super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count
        ;
        pEVar2->super_EmitInfoBase = 0xffffffff;
        pEVar2->type = Any;
        pTVar1 = &(this->m_evalStack).list.
                  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count;
        *pTVar1 = *pTVar1 + 1;
      }
    }
  }
  this->isUnreachable = isUnreachable;
  return;
}

Assistant:

void WasmBytecodeGenerator::SetUnreachableState(bool isUnreachable)
{
    m_writer = isUnreachable ? m_emptyWriter : m_originalWriter;
    if (isUnreachable)
    {
        // Replace the current stack with the any type
        Assert(!m_evalStack.Empty());
        uint32 popped = 0;
        while (m_evalStack.Top().type != WasmTypes::Limit)
        {
            EmitInfo info = m_evalStack.Pop();
            ReleaseLocation(&info);
            ++popped;
        }
        while (popped-- > 0)
        {
            m_evalStack.Push(EmitInfo(WasmTypes::Any));
        }
    }
    this->isUnreachable = isUnreachable;
}